

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu382.c
# Opt level: O2

MPP_RET hal_h265d_vdpu382_wait(void *hal,HalTaskInfo *task)

{
  RK_S32 index;
  long lVar1;
  MPP_RET MVar2;
  RK_U32 RVar3;
  long *plVar4;
  long lVar5;
  MppFrame s;
  int iVar6;
  ulong uVar7;
  MppFrame mframe;
  long local_50;
  long local_48;
  ulong local_40;
  MppFrame frame_out;
  
  lVar5 = (long)(task->dec).reg_index * 0x28;
  plVar4 = (long *)((long)hal + lVar5 + 0x128);
  if (*(int *)((long)hal + 0x180) == 0) {
    plVar4 = (long *)((long)hal + 0x100);
  }
  lVar1 = *plVar4;
  if ((((task->dec).flags.val & 4) == 0) &&
     ((((task->dec).flags.val & 8) == 0 || (*(int *)(*(long *)((long)hal + 0x18) + 0x30) != 0)))) {
    uVar7 = 0;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0x10,(void *)0x0);
    if (MVar2 != MPP_OK) {
      _mpp_log_l(2,"hal_h265d_vdpu382","poll cmd failed %d\n","hal_h265d_vdpu382_wait",
                 (ulong)(uint)MVar2);
      uVar7 = (ulong)(uint)MVar2;
    }
  }
  else {
    uVar7 = 0;
    if (((byte)hal_h265d_debug & 0x20) != 0) {
      uVar7 = 0;
      _mpp_log_l(4,"hal_h265d_vdpu382","%s found task error\n",(char *)0x0,"hal_h265d_vdpu382_wait")
      ;
    }
  }
  local_48 = lVar5;
  local_40 = uVar7;
  if (((ulong)(task->dec).flags & 0xc) == 0) {
    iVar6 = *(int *)((long)hal + 0x180);
    if ((*(uint *)(lVar1 + 0x22c) & 0x5c) == 4) {
      if ((iVar6 != 0) && (*(int *)((long)hal + 400) != 0)) {
        for (uVar7 = 0; uVar7 != 0x11; uVar7 = uVar7 + 1) {
          index = *(RK_S32 *)((long)task + uVar7 * 4 + 0x38);
          if (-1 < index) {
            mframe = (MppFrame)0x0;
            mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x20),index,SLOT_FRAME_PTR,&mframe);
            if (((byte)hal_h265d_debug & 0x10) != 0) {
              _mpp_log_l(4,"hal_h265d_vdpu382","refer[%d] %d frame %p\n",(char *)0x0,
                         uVar7 & 0xffffffff,(ulong)*(uint *)((long)task + uVar7 * 4 + 0x38),mframe);
            }
            if (mframe != (MppFrame)0x0) {
              RVar3 = mpp_frame_get_errinfo(mframe);
              if (RVar3 != 0) {
                frame_out = (MppFrame)0x0;
                mpp_buf_slot_get_prop
                          (*(MppBufSlots *)((long)hal + 0x20),(task->dec).output,SLOT_FRAME_PTR,
                           &frame_out);
                s = frame_out;
                goto LAB_001e9369;
              }
            }
          }
        }
      }
      goto LAB_001e938e;
    }
  }
  else {
    iVar6 = *(int *)((long)hal + 0x180);
  }
  if (iVar6 == 0) {
    if (*(MppCbCtx **)((long)hal + 0x188) != (MppCbCtx *)0x0) {
      mpp_callback_f("hal_h265d_vdpu382_wait",*(MppCbCtx **)((long)hal + 0x188),task);
    }
  }
  else {
    mframe = (MppFrame)0x0;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x20),(task->dec).output,SLOT_FRAME_PTR,&mframe);
    if (mframe != (MppFrame)0x0) {
      *(undefined4 *)((long)hal + 400) = 1;
      s = mframe;
LAB_001e9369:
      mpp_frame_set_errinfo(s,1);
    }
  }
LAB_001e938e:
  local_50 = (long)hal + 0x108;
  uVar7 = 0;
  do {
    iVar6 = (int)uVar7;
    if ((iVar6 == 1) || (iVar6 == 0x2d)) {
      if (((byte)hal_h265d_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h265d_vdpu382","RK_HEVC_DEC: regs[%02d]=%08X\n",(char *)0x0,
                   uVar7 & 0xffffffff,(ulong)*(uint *)(lVar1 + uVar7 * 4));
      }
    }
    else if (iVar6 == 0x44) {
      if (*(int *)((long)hal + 0x180) != 0) {
        *(undefined4 *)(local_50 + local_48) = 0;
      }
      return (MPP_RET)local_40;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static MPP_RET hal_h265d_vdpu382_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    RK_S32 index =  task->dec.reg_index;
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;
    RK_U8* p = NULL;
    Vdpu382H265dRegSet *hw_regs = NULL;
    RK_S32 i;

    if (reg_ctx->fast_mode) {
        hw_regs = ( Vdpu382H265dRegSet *)reg_ctx->g_buf[index].hw_regs;
    } else {
        hw_regs = ( Vdpu382H265dRegSet *)reg_ctx->hw_regs;
    }

    p = (RK_U8*)hw_regs;

    if (task->dec.flags.parse_err ||
        (task->dec.flags.ref_err && !reg_ctx->cfg->base.disable_error)) {
        h265h_dbg(H265H_DBG_TASK_ERR, "%s found task error\n", __FUNCTION__);
        goto ERR_PROC;
    }

    ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

ERR_PROC:
    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err ||
        hw_regs->irq_status.reg224.dec_error_sta ||
        hw_regs->irq_status.reg224.buf_empty_sta ||
        hw_regs->irq_status.reg224.dec_bus_sta ||
        !hw_regs->irq_status.reg224.dec_rdy_sta) {
        if (!reg_ctx->fast_mode) {
            if (reg_ctx->dec_cb)
                mpp_callback(reg_ctx->dec_cb, &task->dec);
        } else {
            MppFrame mframe = NULL;
            mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.output,
                                  SLOT_FRAME_PTR, &mframe);
            if (mframe) {
                reg_ctx->fast_mode_err_found = 1;
                mpp_frame_set_errinfo(mframe, 1);
            }
        }
    } else {
        if (reg_ctx->fast_mode && reg_ctx->fast_mode_err_found) {
            for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(task->dec.refer); i++) {
                if (task->dec.refer[i] >= 0) {
                    MppFrame frame_ref = NULL;

                    mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.refer[i],
                                          SLOT_FRAME_PTR, &frame_ref);
                    h265h_dbg(H265H_DBG_FAST_ERR, "refer[%d] %d frame %p\n",
                              i, task->dec.refer[i], frame_ref);
                    if (frame_ref && mpp_frame_get_errinfo(frame_ref)) {
                        MppFrame frame_out = NULL;
                        mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.output,
                                              SLOT_FRAME_PTR, &frame_out);
                        mpp_frame_set_errinfo(frame_out, 1);
                        break;
                    }
                }
            }
        }
    }

    for (i = 0; i < 68; i++) {
        if (i == 1) {
            h265h_dbg(H265H_DBG_REG, "RK_HEVC_DEC: regs[%02d]=%08X\n",
                      i, *((RK_U32*)p));
        }

        if (i == 45) {
            h265h_dbg(H265H_DBG_REG, "RK_HEVC_DEC: regs[%02d]=%08X\n",
                      i, *((RK_U32*)p));
        }
        p += 4;
    }

    if (reg_ctx->fast_mode) {
        reg_ctx->g_buf[index].use_flag = 0;
    }

    return ret;
}